

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

__pid_t __thiscall
kj::Promise<kj::Array<unsigned_char>_>::wait
          (Promise<kj::Array<unsigned_char>_> *this,void *__stat_loc)

{
  Own<kj::_::PromiseNode> *node;
  Array<unsigned_char> *pAVar1;
  Exception *pEVar2;
  ArrayDisposer *in_RDX;
  Exception *exception_1;
  Exception *exception;
  Array<unsigned_char> *value;
  undefined1 local_1a0 [8];
  ExceptionOr<kj::Array<unsigned_char>_> result;
  WaitScope *waitScope_local;
  Promise<kj::Array<unsigned_char>_> *this_local;
  
  result.value.ptr.field_1.value.disposer = in_RDX;
  _::ExceptionOr<kj::Array<unsigned_char>_>::ExceptionOr
            ((ExceptionOr<kj::Array<unsigned_char>_> *)local_1a0);
  node = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)__stat_loc);
  _::waitImpl(node,(ExceptionOrValue *)local_1a0,
              (WaitScope *)result.value.ptr.field_1.value.disposer);
  pAVar1 = _::readMaybe<kj::Array<unsigned_char>>
                     ((Maybe<kj::Array<unsigned_char>_> *)
                      ((long)&result.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
  if (pAVar1 != (Array<unsigned_char> *)0x0) {
    pEVar2 = _::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1a0);
    if (pEVar2 != (Exception *)0x0) {
      pEVar2 = mv<kj::Exception>(pEVar2);
      throwRecoverableException(pEVar2,0);
    }
    pAVar1 = mv<kj::Array<unsigned_char>>(pAVar1);
    pAVar1 = _::returnMaybeVoid<kj::Array<unsigned_char>>(pAVar1);
    Array<unsigned_char>::Array((Array<unsigned_char> *)this,pAVar1);
    _::ExceptionOr<kj::Array<unsigned_char>_>::~ExceptionOr
              ((ExceptionOr<kj::Array<unsigned_char>_> *)local_1a0);
    return (__pid_t)this;
  }
  pEVar2 = _::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1a0);
  if (pEVar2 != (Exception *)0x0) {
    pEVar2 = mv<kj::Exception>(pEVar2);
    throwFatalException(pEVar2,0);
  }
  _::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }